

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TagExpressionParser::acceptTag(TagExpressionParser *this,string *tag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  Tag local_50;
  
  bVar2 = this->m_isNegated;
  paVar1 = &local_50.m_name.field_2;
  pcVar3 = (tag->_M_dataplus)._M_p;
  local_50.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + tag->_M_string_length);
  local_50.m_isNegated = bVar2;
  TagSet::add(&this->m_currentTagSet,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.m_name._M_dataplus._M_p);
  }
  this->m_isNegated = false;
  return;
}

Assistant:

virtual void acceptTag( std::string const& tag ) {
            m_currentTagSet.add( Tag( tag, m_isNegated ) );
            m_isNegated = false;
        }